

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::lsd_peer_alert::message_abi_cxx11_(string *__return_storage_ptr__,lsd_peer_alert *this)

{
  size_t sVar1;
  char msg [200];
  string local_f8;
  char local_d8 [200];
  
  peer_alert::message_abi_cxx11_(&local_f8,&this->super_peer_alert);
  snprintf(local_d8,200,"%s: received peer from local service discovery",local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_d8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_d8,local_d8 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string lsd_peer_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), "%s: received peer from local service discovery"
			, peer_alert::message().c_str());
		return msg;
	}